

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O1

bool __thiscall
SQCompilation::SQCompilationContext::isRequireDisabled(SQCompilationContext *this,int line,int col)

{
  sqvector<SQCompilation::CommentData,_unsigned_int> *psVar1;
  CommentData *pCVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (this->_comments == (Comments *)0x0) {
    return false;
  }
  psVar1 = (this->_comments->_commentsList)._vals;
  uVar4 = (ulong)psVar1[line - 1U]._size;
  bVar6 = uVar4 != 0;
  if (bVar6) {
    pCVar2 = psVar1[line - 1U]._vals;
    lVar5 = 0;
    do {
      pcVar3 = strstr(*(char **)((long)&pCVar2->text + lVar5),"-skip-require");
      if (pcVar3 != (char *)0x0) {
        return true;
      }
      lVar5 = lVar5 + 0x30;
      bVar6 = uVar4 * 0x30 != lVar5;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool SQCompilationContext::isRequireDisabled(int line, int col) {
  if (!_comments)
    return false;

  auto &lineCmts = _comments->lineComment(line);
  for (auto &comment : lineCmts) {
    if (strstr(comment.text, "-skip-require"))
      return true;
  }

  return false;
}